

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::memtypeContinued<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Type addressType)

{
  ParseModuleTypesCtx *pPVar1;
  bool bVar2;
  bool local_e3;
  Ok local_d1;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  byte local_bd;
  uint local_bc;
  undefined1 local_b8 [3];
  bool shared;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Ok> _val;
  undefined1 local_50 [8];
  Result<wasm::Ok> limits;
  ParseModuleTypesCtx *ctx_local;
  Type addressType_local;
  
  limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_4_ = 2;
  ctx_local = (ParseModuleTypesCtx *)addressType.id;
  addressType_local.id = (uintptr_t)__return_storage_ptr__;
  bVar2 = wasm::Type::operator==
                    ((Type *)&ctx_local,
                     (BasicType *)
                     ((long)&limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x24));
  local_e3 = true;
  if (!bVar2) {
    limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x03';
    limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_3_ = 0;
    local_e3 = wasm::Type::operator==
                         ((Type *)&ctx_local,
                          (BasicType *)
                          ((long)&limits.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  if (local_e3 != false) {
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _36_4_ = 2;
    bVar2 = wasm::Type::operator==
                      ((Type *)&ctx_local,
                       (BasicType *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x24));
    if (bVar2) {
      limits32<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)local_50,ctx);
    }
    else {
      limits64<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)local_50,ctx);
    }
    Result<wasm::Ok>::Result((Result<wasm::Ok> *)local_80,(Result<wasm::Ok> *)local_50);
    local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_80);
    bVar2 = local_98 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err((Err *)local_b8,local_98);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)local_b8);
      wasm::Err::~Err((Err *)local_b8);
    }
    local_bc = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_80);
    if (local_bc == 0) {
      local_bd = 0;
      local_d0 = sv("shared",6);
      bVar2 = Lexer::takeKeyword(&ctx->in,local_d0);
      pPVar1 = ctx_local;
      if (bVar2) {
        local_bd = 1;
      }
      Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_50);
      ParseModuleTypesCtx::makeMemType(ctx,pPVar1,local_bd & 1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d1);
      local_bc = 1;
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_50);
    return __return_storage_ptr__;
  }
  __assert_fail("addressType == Type::i32 || addressType == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parsers.h"
                ,0x336,
                "Result<typename Ctx::MemTypeT> wasm::WATParser::memtypeContinued(Ctx &, Type) [Ctx = wasm::WATParser::ParseModuleTypesCtx]"
               );
}

Assistant:

Result<typename Ctx::MemTypeT> memtypeContinued(Ctx& ctx, Type addressType) {
  assert(addressType == Type::i32 || addressType == Type::i64);
  auto limits = addressType == Type::i32 ? limits32(ctx) : limits64(ctx);
  CHECK_ERR(limits);
  bool shared = false;
  if (ctx.in.takeKeyword("shared"sv)) {
    shared = true;
  }
  return ctx.makeMemType(addressType, *limits, shared);
}